

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_asn1.cc
# Opt level: O1

RSA * RSA_public_key_from_bytes(uint8_t *in,size_t in_len)

{
  RSA *r;
  CBS cbs;
  CBS local_18;
  
  local_18.data = in;
  local_18.len = in_len;
  r = RSA_parse_public_key(&local_18);
  if ((r == (RSA *)0x0) || (local_18.len != 0)) {
    ERR_put_error(4,0,100,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rsa/rsa_asn1.cc"
                  ,0x4e);
    RSA_free((RSA *)r);
    r = (RSA *)0x0;
  }
  return r;
}

Assistant:

RSA *RSA_public_key_from_bytes(const uint8_t *in, size_t in_len) {
  CBS cbs;
  CBS_init(&cbs, in, in_len);
  RSA *ret = RSA_parse_public_key(&cbs);
  if (ret == NULL || CBS_len(&cbs) != 0) {
    OPENSSL_PUT_ERROR(RSA, RSA_R_BAD_ENCODING);
    RSA_free(ret);
    return NULL;
  }
  return ret;
}